

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::SobolSampler::GetPixel2D(SobolSampler *this)

{
  float *pfVar1;
  int *piVar2;
  long in_RDI;
  float fVar3;
  int dim;
  Point2f u;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  Tuple2<pbrt::Point2,_float> local_8;
  
  SobolSample<pbrt::NoRandomizer>(*(undefined8 *)(in_RDI + 0x20),0);
  SobolSample<pbrt::NoRandomizer>(*(undefined8 *)(in_RDI + 0x20),1);
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,local_18);
    fVar3 = *pfVar1 * (float)*(int *)(in_RDI + 4);
    piVar2 = Tuple2<pbrt::Point2,_int>::operator[]
                       ((Tuple2<pbrt::Point2,_int> *)(in_RDI + 0x10),local_18);
    fVar3 = Clamp<float,int,float>(fVar3 - (float)*piVar2,0,0.99999994);
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](&local_8,local_18);
    *pfVar1 = fVar3;
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f GetPixel2D() {
        Point2f u(SobolSample(sobolIndex, 0, NoRandomizer()),
                  SobolSample(sobolIndex, 1, NoRandomizer()));
        // Remap Sobol\+$'$ dimensions used for pixel samples
        for (int dim = 0; dim < 2; ++dim) {
            DCHECK_RARE(1e-7, u[dim] * scale - pixel[dim] < 0);
            DCHECK_RARE(1e-7, u[dim] * scale - pixel[dim] > 1);
            u[dim] = Clamp(u[dim] * scale - pixel[dim], 0, OneMinusEpsilon);
        }

        return u;
    }